

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall QSidebar::showContextMenu(QSidebar *this,QPoint *position)

{
  QPoint this_00;
  undefined4 *puVar1;
  long in_FS_OFFSET;
  QObject local_b8 [8];
  undefined1 local_b0 [16];
  long *local_a0;
  QUrl local_98;
  QArrayData *local_90;
  ImplFn local_88;
  long local_80;
  QList<QAction_*> local_78;
  code *local_58 [3];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (QAction **)0x0;
  local_78.d.size = 0;
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1f0))(local_58,this,position);
  if (((-1 < (int)local_58[0]._0_4_) && (-1 < (long)local_58[0])) && (local_58[2] != (code *)0x0)) {
    this_00 = (QPoint)operator_new(0x10);
    QMetaObject::tr((char *)local_58,(char *)&QFileDialog::staticMetaObject,0x6e63b4);
    QAction::QAction((QAction *)this_00,(QString *)local_58,(QObject *)this);
    if ((QPoint)local_58[0] != (QPoint)0x0) {
      LOCK();
      *(int *)local_58[0] = *(int *)local_58[0] + -1;
      UNLOCK();
      if (*(int *)local_58[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_58[0],2,0x10);
      }
    }
    (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea
                           .super_QFrame.super_QWidget + 0x1f0))(local_b0,this,position);
    if (local_a0 == (long *)0x0) {
      local_58[0] = (code *)0x0;
      local_58[1] = (code *)0x0;
      local_58[2] = (code *)0x0;
      local_40 = 2;
    }
    else {
      (**(code **)(*local_a0 + 0x90))(local_58,local_a0,local_b0,0x101);
    }
    ::QVariant::toUrl();
    QUrl::path(&local_90,&local_98,0x7f00000);
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_90,2,0x10);
      }
    }
    QUrl::~QUrl(&local_98);
    ::QVariant::~QVariant((QVariant *)local_58);
    if (local_80 == 0) {
      QAction::setEnabled(this_00.xp.m_i._0_1_);
    }
    local_90 = (QArrayData *)removeEntry;
    local_88 = (ImplFn)0x0;
    local_58[0] = QAction::triggered;
    local_58[1] = (code *)0x0;
    puVar1 = (undefined4 *)operator_new(0x20);
    *puVar1 = 1;
    *(code **)(puVar1 + 2) =
         QtPrivate::QCallableObject<void_(QSidebar::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar1 + 4) = removeEntry;
    *(undefined8 *)(puVar1 + 6) = 0;
    QObject::connectImpl
              (local_b8,(void **)this_00,(QObject *)local_58,(void **)this,
               (QSlotObjectBase *)&local_90,(ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    local_58[0] = (code *)this_00;
    QtPrivate::QPodArrayOps<QAction*>::emplace<QAction*&>
              ((QPodArrayOps<QAction*> *)&local_78,local_78.d.size,(QAction **)local_58);
    QList<QAction_*>::end(&local_78);
    if (local_78.d.size != 0) {
      local_58[0] = (code *)QWidget::mapToGlobal((QWidget *)this,position);
      QMenu::exec(&local_78,(QPoint *)local_58,(QAction *)0x0,(QWidget *)0x0);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSidebar::showContextMenu(const QPoint &position)
{
    QList<QAction *> actions;
    if (indexAt(position).isValid()) {
        QAction *action = new QAction(QFileDialog::tr("Remove"), this);
        if (indexAt(position).data(QUrlModel::UrlRole).toUrl().path().isEmpty())
            action->setEnabled(false);
        connect(action, &QAction::triggered, this, &QSidebar::removeEntry);
        actions.append(action);
    }
    if (actions.size() > 0)
        QMenu::exec(actions, mapToGlobal(position));
}